

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop_helper.c
# Opt level: O1

target_ulong_conflict
helper_ldfsr_sparc(CPUSPARCState *env,target_ulong_conflict old_fsr,uint32_t new_fsr)

{
  (env->fp_status).float_rounding_mode = (char)(0x1020300 >> ((byte)(new_fsr >> 0x1b) & 0x18));
  return (old_fsr & 0xfc000) + (new_fsr & 0xcfc00fff);
}

Assistant:

static void set_fsr(CPUSPARCState *env, target_ulong fsr)
{
    int rnd_mode;

    switch (fsr & FSR_RD_MASK) {
    case FSR_RD_NEAREST:
        rnd_mode = float_round_nearest_even;
        break;
    default:
    case FSR_RD_ZERO:
        rnd_mode = float_round_to_zero;
        break;
    case FSR_RD_POS:
        rnd_mode = float_round_up;
        break;
    case FSR_RD_NEG:
        rnd_mode = float_round_down;
        break;
    }
    set_float_rounding_mode(rnd_mode, &env->fp_status);
}